

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::pop(TimerMgr *this)

{
  reference ppTVar1;
  shared_ptr<hwnet::util::Timer> local_28;
  value_type local_18;
  value_type e;
  TimerMgr *this_local;
  
  if (this->elements_size != 0) {
    e = (value_type)this;
    ppTVar1 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,0);
    local_18 = *ppTVar1;
    swap(this,1,this->elements_size);
    local_18->mIndex = 0;
    local_18->mMgr = (TimerMgr *)0x0;
    std::shared_ptr<hwnet::util::Timer>::shared_ptr(&local_28,(nullptr_t)0x0);
    std::shared_ptr<hwnet::util::Timer>::operator=(&local_18->selfPtr,&local_28);
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&local_28);
    ppTVar1 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,this->elements_size - 1);
    *ppTVar1 = (value_type)0x0;
    this->elements_size = this->elements_size - 1;
    down(this,1);
  }
  return;
}

Assistant:

void pop() {
		if(this->elements_size > 0) {
			auto e = this->elements[0];
			this->swap(1,this->elements_size);
			e->mIndex = 0;
			e->mMgr  = nullptr;		
			e->selfPtr = nullptr;	
			this->elements[this->elements_size-1] = nullptr;
			--this->elements_size;
			this->down(1);
		}
	}